

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationsTest::prepareAttributes
          (VertexAttribLocationsTest *this,GLuint test_case_index,ProgramInterface *param_2,
          Buffer *buffer,VertexArray *vao)

{
  int iVar1;
  reference data;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  size_type sVar3;
  bool local_79;
  bool isBaseInstanced;
  GLubyte *ptr;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_data;
  VertexArray *vao_local;
  Buffer *buffer_local;
  ProgramInterface *param_4_local;
  GLuint test_case_index_local;
  VertexAttribLocationsTest *this_local;
  
  buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &vao->m_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0x10);
  data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
  if (1 < test_case_index) {
    buffer->m_buffer = Element;
  }
  Utils::VertexArray::Bind
            ((VertexArray *)
             buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  Utils::Buffer::Bind(buffer);
  Utils::VertexArray::Attribute
            ((VertexArray *)
             buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,2,(Type *)&Utils::Type::uint,0,'\0',0,
             (GLvoid *)0x0);
  Utils::VertexArray::Attribute
            ((VertexArray *)
             buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,5,(Type *)&Utils::Type::uint,0,'\0',0,
             (GLvoid *)0x20);
  local_79 = test_case_index == 5 || test_case_index == 7;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  Utils::VertexArray::Divisor((Functions *)CONCAT44(extraout_var,iVar1),5,local_79 + 1);
  (data + 4)[0] = 4;
  (data + 4)[1] = 5;
  (data + 6)[0] = 6;
  (data + 6)[1] = 7;
  data[0] = 0;
  data[1] = 1;
  (data + 2)[0] = 2;
  (data + 2)[1] = 3;
  (data + 0xc)[0] = 4;
  (data + 0xc)[1] = 5;
  (data + 0xe)[0] = 6;
  (data + 0xe)[1] = 7;
  (data + 8)[0] = 0;
  (data + 8)[1] = 1;
  (data + 10)[0] = 2;
  (data + 10)[1] = 3;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  Utils::Buffer::Data(buffer,StaticDraw,sVar3 << 2,data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void VertexAttribLocationsTest::prepareAttributes(GLuint test_case_index /* test_case_index */,
												  Utils::ProgramInterface& /* program_interface */,
												  Utils::Buffer& buffer, Utils::VertexArray& vao)
{
	static const GLuint vertex_index_data[8]   = { 0, 1, 2, 3, 4, 5, 6, 7 };
	static const GLuint instance_index_data[8] = { 0, 1, 2, 3, 4, 5, 6, 7 };

	std::vector<GLuint> buffer_data;
	buffer_data.resize(8 + 8); /* vertex_index_data + instance_index_data */

	GLubyte* ptr = (GLubyte*)&buffer_data[0];

	/*
	 When case index >=2, the test calls glDrawElement*(), such as glDrawElementsBaseVertex(), glDrawElementsInstanced(), glDrawElementsInstancedBaseInstance() and so on,
	 So we need to change the buffer type as GL_ELEMENT_ARRAY_BUFFER
	 */
	if (test_case_index >= 2)
	{
		buffer.m_buffer = Utils::Buffer::Element;
	}
	vao.Bind();
	buffer.Bind();

	vao.Attribute(m_loc_vertex /* vertex_index */, Utils::Type::uint, 0 /* array_elements */, false /* normalized */,
				  0 /* stride */, 0 /* offset */);

	vao.Attribute(m_loc_instance /* instance_index */, Utils::Type::uint, 0 /* array_elements */,
				  false /* normalized */, 0 /* stride */, (GLvoid*)sizeof(vertex_index_data) /* offset */);
	// when test_case_index is 5 or 7, the draw call is glDrawElementsInstancedBaseInstance, glDrawElementsInstancedBaseVertexBaseInstance
	// the instancecount is 4, the baseinstance is 2, the divisor should be set 2
	bool isBaseInstanced = (test_case_index == DRAWELEMENTSINSTANCEDBASEINSTANCE ||
							test_case_index == DRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE);
	vao.Divisor(m_context.getRenderContext().getFunctions() /* gl */, m_loc_instance /* instance_index */,
				isBaseInstanced ? 2 : 1 /* divisor. 1 - advance once per instance */);

	memcpy(ptr + 0, vertex_index_data, sizeof(vertex_index_data));
	memcpy(ptr + sizeof(vertex_index_data), instance_index_data, sizeof(instance_index_data));

	buffer.Data(Utils::Buffer::StaticDraw, buffer_data.size() * sizeof(GLuint), ptr);
}